

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O3

void __thiscall chrono::ChLinkLock::UpdateForces(ChLinkLock *this,double mytime)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChLinkForce *pCVar4;
  ChLinkLimit *pCVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar22 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar18 [16];
  undefined1 auVar27 [64];
  undefined1 auVar19 [16];
  undefined1 auVar28 [64];
  undefined1 auVar20 [16];
  undefined1 auVar29 [64];
  undefined1 auVar21 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar30 [64];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  ChVector<double> arm_xaxis;
  double local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  double local_78;
  undefined8 uStack_70;
  ChVector<double> local_28;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  
  ChLinkMarkers::UpdateForces(&this->super_ChLinkMarkers,mytime);
  pCVar4 = (this->force_D)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkForce *)0x0) && (pCVar4->m_active == true)) {
    dVar11 = ChLinkForce::GetForce
                       (pCVar4,(this->super_ChLinkMarkers).dist - this->d_restlength,
                        (this->super_ChLinkMarkers).dist_dt,
                        (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.
                        super_ChPhysicsItem.super_ChObj.ChTime);
    dVar13 = (this->super_ChLinkMarkers).relM.pos.m_data[1];
    dVar14 = (this->super_ChLinkMarkers).relM.pos.m_data[0];
    auVar32._8_8_ = 0;
    auVar32._0_8_ = dVar14;
    dVar31 = (this->super_ChLinkMarkers).relM.pos.m_data[2];
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar31;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = dVar13 * dVar13;
    auVar32 = vfmadd231sd_fma(auVar44,auVar32,auVar32);
    auVar32 = vfmadd231sd_fma(auVar32,auVar39,auVar39);
    auVar32 = vsqrtsd_avx(auVar32,auVar32);
    bVar6 = 2.2250738585072014e-308 <= auVar32._0_8_;
    dVar43 = 1.0 / auVar32._0_8_;
    dVar15 = (this->super_ChLinkMarkers).C_force.m_data[2];
    dVar12 = (this->super_ChLinkMarkers).C_force.m_data[1];
    (this->super_ChLinkMarkers).C_force.m_data[0] =
         dVar11 * (double)((ulong)bVar6 * (long)(dVar14 * dVar43) +
                          (ulong)!bVar6 * 0x3ff0000000000000) +
         (this->super_ChLinkMarkers).C_force.m_data[0];
    (this->super_ChLinkMarkers).C_force.m_data[1] =
         dVar11 * (double)((ulong)bVar6 * (long)(dVar13 * dVar43)) + dVar12;
    (this->super_ChLinkMarkers).C_force.m_data[2] =
         dVar11 * (double)((ulong)bVar6 * (long)(dVar31 * dVar43)) + dVar15;
  }
  pCVar4 = (this->force_R)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkForce *)0x0) && (pCVar4->m_active == true)) {
    dVar12 = ChLinkForce::GetForce
                       (pCVar4,(this->super_ChLinkMarkers).relAngle,0.0,
                        (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.
                        super_ChPhysicsItem.super_ChObj.ChTime);
    dVar13 = (this->super_ChLinkMarkers).relAxis.m_data[2];
    dVar31 = (this->super_ChLinkMarkers).relAxis.m_data[1];
    dVar14 = (this->super_ChLinkMarkers).C_torque.m_data[2];
    dVar15 = (this->super_ChLinkMarkers).C_torque.m_data[1];
    (this->super_ChLinkMarkers).C_torque.m_data[0] =
         dVar12 * (this->super_ChLinkMarkers).relAxis.m_data[0] +
         (this->super_ChLinkMarkers).C_torque.m_data[0];
    (this->super_ChLinkMarkers).C_torque.m_data[1] = dVar12 * dVar31 + dVar15;
    (this->super_ChLinkMarkers).C_torque.m_data[2] = dVar12 * dVar13 + dVar14;
    dVar13 = (this->super_ChLinkMarkers).relWvel.m_data[1];
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (this->super_ChLinkMarkers).relWvel.m_data[0];
    auVar33._8_8_ = 0;
    auVar33._0_8_ = dVar13 * dVar13;
    auVar32 = vfmadd231sd_fma(auVar33,auVar16,auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (this->super_ChLinkMarkers).relWvel.m_data[2];
    auVar32 = vfmadd213sd_fma(auVar17,auVar17,auVar32);
    auVar32 = vsqrtsd_avx(auVar32,auVar32);
    dVar11 = ChLinkForce::GetForce
                       ((this->force_R)._M_t.
                        super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>
                        .super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl,0.0,
                        auVar32._0_8_,
                        (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.
                        super_ChPhysicsItem.super_ChObj.ChTime);
    dVar13 = (this->super_ChLinkMarkers).relWvel.m_data[1];
    dVar14 = (this->super_ChLinkMarkers).relWvel.m_data[0];
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar14;
    dVar31 = (this->super_ChLinkMarkers).relWvel.m_data[2];
    auVar40._8_8_ = 0;
    auVar40._0_8_ = dVar31;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = dVar13 * dVar13;
    auVar32 = vfmadd231sd_fma(auVar45,auVar34,auVar34);
    auVar32 = vfmadd231sd_fma(auVar32,auVar40,auVar40);
    auVar32 = vsqrtsd_avx(auVar32,auVar32);
    bVar6 = 2.2250738585072014e-308 <= auVar32._0_8_;
    dVar43 = 1.0 / auVar32._0_8_;
    dVar15 = (this->super_ChLinkMarkers).C_torque.m_data[2];
    dVar12 = (this->super_ChLinkMarkers).C_torque.m_data[1];
    (this->super_ChLinkMarkers).C_torque.m_data[0] =
         dVar11 * (double)((ulong)bVar6 * (long)(dVar14 * dVar43) +
                          (ulong)!bVar6 * 0x3ff0000000000000) +
         (this->super_ChLinkMarkers).C_torque.m_data[0];
    (this->super_ChLinkMarkers).C_torque.m_data[1] =
         dVar11 * (double)((ulong)bVar6 * (long)(dVar13 * dVar43)) + dVar12;
    (this->super_ChLinkMarkers).C_torque.m_data[2] =
         dVar11 * (double)((ulong)bVar6 * (long)(dVar31 * dVar43)) + dVar15;
  }
  dVar13 = DAT_00b689a8;
  pCVar4 = (this->force_X)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = VNULL;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = DAT_00b689a0;
  if ((pCVar4 != (ChLinkForce *)0x0) && (pCVar4->m_active == true)) {
    auVar26._0_8_ =
         ChLinkForce::GetForce
                   (pCVar4,(this->super_ChLinkMarkers).relM.pos.m_data[0],
                    (this->super_ChLinkMarkers).relM_dt.pos.m_data[0],
                    (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
                    super_ChObj.ChTime);
    auVar26._8_56_ = extraout_var;
    auVar18 = auVar26._0_16_;
  }
  pCVar4 = (this->force_Y)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkForce *)0x0) && (pCVar4->m_active == true)) {
    auVar27._0_8_ =
         ChLinkForce::GetForce
                   (pCVar4,(this->super_ChLinkMarkers).relM.pos.m_data[1],
                    (this->super_ChLinkMarkers).relM_dt.pos.m_data[1],
                    (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
                    super_ChObj.ChTime);
    auVar27._8_56_ = extraout_var_00;
    auVar19 = auVar27._0_16_;
  }
  pCVar4 = (this->force_Z)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkForce *)0x0) && (pCVar4->m_active == true)) {
    dVar13 = ChLinkForce::GetForce
                       (pCVar4,(this->super_ChLinkMarkers).relM.pos.m_data[2],
                        (this->super_ChLinkMarkers).relM_dt.pos.m_data[2],
                        (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.
                        super_ChPhysicsItem.super_ChObj.ChTime);
  }
  auVar32 = vunpcklpd_avx(auVar18,auVar19);
  dVar14 = (this->super_ChLinkMarkers).C_force.m_data[2];
  dVar31 = (this->super_ChLinkMarkers).C_force.m_data[1];
  (this->super_ChLinkMarkers).C_force.m_data[0] =
       auVar32._0_8_ + (this->super_ChLinkMarkers).C_force.m_data[0];
  (this->super_ChLinkMarkers).C_force.m_data[1] = auVar32._8_8_ + dVar31;
  (this->super_ChLinkMarkers).C_force.m_data[2] = dVar13 + dVar14;
  dVar13 = DAT_00b689a8;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = VNULL;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = DAT_00b689a0;
  pCVar4 = (this->force_Rx)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkForce *)0x0) && (pCVar4->m_active == true)) {
    auVar28._0_8_ =
         ChLinkForce::GetForce
                   (pCVar4,(this->super_ChLinkMarkers).relRotaxis.m_data[0],
                    (this->super_ChLinkMarkers).relWvel.m_data[0],
                    (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
                    super_ChObj.ChTime);
    auVar28._8_56_ = extraout_var_01;
    auVar20 = auVar28._0_16_;
  }
  pCVar4 = (this->force_Ry)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkForce *)0x0) && (pCVar4->m_active == true)) {
    auVar29._0_8_ =
         ChLinkForce::GetForce
                   (pCVar4,(this->super_ChLinkMarkers).relRotaxis.m_data[1],
                    (this->super_ChLinkMarkers).relWvel.m_data[1],
                    (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
                    super_ChObj.ChTime);
    auVar29._8_56_ = extraout_var_02;
    auVar21 = auVar29._0_16_;
  }
  pCVar4 = (this->force_Rz)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkForce *)0x0) && (pCVar4->m_active == true)) {
    dVar13 = ChLinkForce::GetForce
                       (pCVar4,(this->super_ChLinkMarkers).relRotaxis.m_data[2],
                        (this->super_ChLinkMarkers).relWvel.m_data[2],
                        (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.
                        super_ChPhysicsItem.super_ChObj.ChTime);
  }
  auVar32 = vunpcklpd_avx(auVar20,auVar21);
  dVar14 = (this->super_ChLinkMarkers).C_torque.m_data[2];
  dVar31 = (this->super_ChLinkMarkers).C_torque.m_data[1];
  (this->super_ChLinkMarkers).C_torque.m_data[0] =
       auVar32._0_8_ + (this->super_ChLinkMarkers).C_torque.m_data[0];
  (this->super_ChLinkMarkers).C_torque.m_data[1] = auVar32._8_8_ + dVar31;
  (this->super_ChLinkMarkers).C_torque.m_data[2] = dVar13 + dVar14;
  dVar14 = DAT_00b689a8;
  dVar13 = DAT_00b689a0;
  pCVar5 = (this->limit_X)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  local_98._8_8_ = 0;
  local_98._0_8_ = VNULL;
  local_a8 = VNULL;
  uStack_a0 = 0;
  if (pCVar5 != (ChLinkLimit *)0x0) {
    uStack_a0 = 0;
    if (pCVar5->m_active == true) {
      local_a8 = ChLinkLimit::GetForce
                           (pCVar5,(this->super_ChLinkMarkers).relM.pos.m_data[0],
                            (this->super_ChLinkMarkers).relM_dt.pos.m_data[0]);
      uStack_a0 = extraout_XMM0_Qb;
    }
  }
  pCVar5 = (this->limit_Y)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  uStack_70 = 0;
  local_78 = dVar13;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (uStack_70 = 0, pCVar5->m_active == true)) {
    local_78 = ChLinkLimit::GetForce
                         (pCVar5,(this->super_ChLinkMarkers).relM.pos.m_data[1],
                          (this->super_ChLinkMarkers).relM_dt.pos.m_data[1]);
    uStack_70 = extraout_XMM0_Qb_00;
  }
  local_88._8_8_ = 0;
  local_88._0_8_ = dVar14;
  pCVar5 = (this->limit_Z)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    auVar30._0_8_ =
         ChLinkLimit::GetForce
                   (pCVar5,(this->super_ChLinkMarkers).relM.pos.m_data[2],
                    (this->super_ChLinkMarkers).relM_dt.pos.m_data[2]);
    auVar30._8_56_ = extraout_var_03;
    local_88 = auVar30._0_16_;
  }
  pCVar5 = (this->limit_D)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    dVar31 = (this->super_ChLinkMarkers).relM.pos.m_data[1];
    dVar15 = (this->super_ChLinkMarkers).relM.pos.m_data[0];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar15;
    dVar12 = (this->super_ChLinkMarkers).relM.pos.m_data[2];
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar12;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar31 * dVar31;
    auVar32 = vfmadd231sd_fma(auVar41,auVar22,auVar22);
    auVar32 = vfmadd231sd_fma(auVar32,auVar38,auVar38);
    auVar32 = vsqrtsd_avx(auVar32,auVar32);
    bVar6 = 2.2250738585072014e-308 <= auVar32._0_8_;
    dVar43 = 1.0 / auVar32._0_8_;
    dVar11 = ChLinkLimit::GetForce
                       (pCVar5,(this->super_ChLinkMarkers).dist,(this->super_ChLinkMarkers).dist_dt)
    ;
    local_a8 = local_a8 +
               dVar11 * (double)((ulong)bVar6 * (long)(dVar15 * dVar43) +
                                (ulong)!bVar6 * 0x3ff0000000000000);
    uStack_a0 = 0;
    local_78 = local_78 + dVar11 * (double)((ulong)bVar6 * (long)(dVar31 * dVar43));
    uStack_70 = 0;
    local_88._8_8_ = 0;
    local_88._0_8_ =
         (double)local_88._0_8_ + dVar11 * (double)((ulong)bVar6 * (long)(dVar12 * dVar43));
  }
  pCVar5 = (this->limit_Rx)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    local_98._0_8_ =
         ChLinkLimit::GetForce
                   (pCVar5,(this->super_ChLinkMarkers).relRotaxis.m_data[0],
                    (this->super_ChLinkMarkers).relWvel.m_data[0]);
    local_98._8_8_ = extraout_XMM0_Qb_01;
  }
  pCVar5 = (this->limit_Ry)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    dVar13 = ChLinkLimit::GetForce
                       (pCVar5,(this->super_ChLinkMarkers).relRotaxis.m_data[1],
                        (this->super_ChLinkMarkers).relWvel.m_data[1]);
  }
  pCVar5 = (this->limit_Rz)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    dVar14 = ChLinkLimit::GetForce
                       (pCVar5,(this->super_ChLinkMarkers).relRotaxis.m_data[2],
                        (this->super_ChLinkMarkers).relWvel.m_data[2]);
  }
  pCVar5 = (this->limit_Rp)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    VaxisXfromQuat(&(this->super_ChLinkMarkers).relM.rot);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_28.m_data[2];
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_28.m_data[1] * 0.0 + local_28.m_data[0];
    auVar32 = vfmadd231sd_fma(auVar23,ZEXT816(0) << 0x40,auVar1);
    dVar12 = acos(auVar32._0_8_);
    dVar11 = VangleRX<double>(&local_28);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_28.m_data[1];
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_28.m_data[2];
    auVar48._8_8_ = 0;
    auVar48._0_8_ = DAT_00b689c0;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = VECT_X;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = DAT_00b689b8;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_28.m_data[1] * DAT_00b689c0;
    auVar44 = vfmsub231sd_fma(auVar49,auVar46,auVar35);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_28.m_data[2] * VECT_X;
    auVar32 = vfmsub231sd_fma(auVar36,auVar48,ZEXT816(0));
    auVar47._8_8_ = 0;
    auVar47._0_8_ = DAT_00b689b8 * -0.0;
    auVar39 = vfmadd231sd_fma(auVar47,auVar42,auVar24);
    dVar31 = auVar32._0_8_;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar31 * dVar31;
    auVar32 = vfmadd231sd_fma(auVar25,auVar44,auVar44);
    auVar32 = vfmadd231sd_fma(auVar32,auVar39,auVar39);
    auVar32 = vsqrtsd_avx(auVar32,auVar32);
    dVar15 = 1.0 / auVar32._0_8_;
    bVar6 = 2.2250738585072014e-308 <= auVar32._0_8_;
    dVar31 = (double)((ulong)bVar6 * (long)(dVar31 * dVar15));
    auVar9._0_8_ = (double)((ulong)bVar6 * (long)(auVar44._0_8_ * dVar15) +
                           (ulong)!bVar6 * 0x3ff0000000000000);
    auVar9._8_8_ = 0;
    dVar15 = (double)((ulong)bVar6 * (long)(auVar39._0_8_ * dVar15));
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar15;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (this->super_ChLinkMarkers).relWvel.m_data[0];
    auVar37._8_8_ = 0;
    auVar37._0_8_ = dVar31 * (this->super_ChLinkMarkers).relWvel.m_data[1];
    auVar32 = vfmadd231sd_fma(auVar37,auVar9,auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (this->super_ChLinkMarkers).relWvel.m_data[2];
    auVar32 = vfmadd231sd_fma(auVar32,auVar10,auVar3);
    dVar12 = ChLinkLimit::GetPolarForce
                       ((this->limit_Rp)._M_t.
                        super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
                        .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl,dVar12,
                        auVar32._0_8_,dVar11);
    local_98._8_8_ = 0;
    local_98._0_8_ = (double)local_98._0_8_ + dVar12 * auVar9._0_8_;
    dVar13 = dVar13 + dVar12 * dVar31;
    dVar14 = dVar14 + dVar12 * dVar15;
  }
  auVar7._8_8_ = uStack_a0;
  auVar7._0_8_ = local_a8;
  auVar32 = vunpcklpd_avx(local_88,local_98);
  dVar31 = (this->super_ChLinkMarkers).C_torque.m_data[2];
  dVar15 = (this->super_ChLinkMarkers).C_torque.m_data[1];
  auVar8._8_8_ = uStack_70;
  auVar8._0_8_ = local_78;
  auVar39 = vunpcklpd_avx(auVar7,auVar8);
  dVar12 = (this->super_ChLinkMarkers).C_force.m_data[1];
  dVar11 = (this->super_ChLinkMarkers).C_force.m_data[2];
  dVar43 = (this->super_ChLinkMarkers).C_torque.m_data[0];
  (this->super_ChLinkMarkers).C_force.m_data[0] =
       auVar39._0_8_ + (this->super_ChLinkMarkers).C_force.m_data[0];
  (this->super_ChLinkMarkers).C_force.m_data[1] = auVar39._8_8_ + dVar12;
  (this->super_ChLinkMarkers).C_force.m_data[2] = auVar32._0_8_ + dVar11;
  (this->super_ChLinkMarkers).C_torque.m_data[0] = auVar32._8_8_ + dVar43;
  (this->super_ChLinkMarkers).C_torque.m_data[1] = dVar13 + dVar15;
  (this->super_ChLinkMarkers).C_torque.m_data[2] = dVar14 + dVar31;
  return;
}

Assistant:

void ChLinkLock::UpdateForces(double mytime) {
    ChLinkMarkers::UpdateForces(mytime);

    ChVector<> m_force = VNULL;
    ChVector<> m_torque = VNULL;

    // COMPUTE THE FORCES IN THE LINK, FOR EXAMPLE
    // CAUSED BY SPRINGS
    // NOTE!!!!!   C_force and C_torque   are considered in the reference coordsystem
    // of marker2  (the MAIN marker), and their application point is considered the
    // origin of marker1 (the SLAVE marker)

    // 1)========== the generic spring-damper

    if (force_D && force_D->IsActive()) {
        double dfor;
        dfor = force_D->GetForce((dist - d_restlength), dist_dt, ChTime);
        m_force = Vmul(Vnorm(relM.pos), dfor);

        C_force = Vadd(C_force, m_force);
    }

    // 2)========== the generic torsional spring / torsional damper

    if (force_R && force_R->IsActive()) {
        double tor;
        // 1) the tors. spring
        tor = force_R->GetForce(relAngle, 0, ChTime);
        m_torque = Vmul(relAxis, tor);
        C_torque = Vadd(C_torque, m_torque);
        // 2) the tors. damper
        double angle_dt = Vlength(relWvel);
        tor = force_R->GetForce(0, angle_dt, ChTime);
        m_torque = Vmul(Vnorm(relWvel), tor);
        C_torque = Vadd(C_torque, m_torque);
    }

    // 3)========== the XYZ forces

    m_force = VNULL;

    if (force_X && force_X->IsActive()) {
        m_force.x() = force_X->GetForce(relM.pos.x(), relM_dt.pos.x(), ChTime);
    }

    if (force_Y && force_Y->IsActive()) {
        m_force.y() = force_Y->GetForce(relM.pos.y(), relM_dt.pos.y(), ChTime);
    }

    if (force_Z && force_Z->IsActive()) {
        m_force.z() = force_Z->GetForce(relM.pos.z(), relM_dt.pos.z(), ChTime);
    }

    C_force = Vadd(C_force, m_force);

    // 4)========== the RxRyRz forces (torques)

    m_torque = VNULL;

    if (force_Rx && force_Rx->IsActive()) {
        m_torque.x() = force_Rx->GetForce(relRotaxis.x(), relWvel.x(), ChTime);
    }

    if (force_Ry && force_Ry->IsActive()) {
        m_torque.y() = force_Ry->GetForce(relRotaxis.y(), relWvel.y(), ChTime);
    }

    if (force_Rz && force_Rz->IsActive()) {
        m_torque.z() = force_Rz->GetForce(relRotaxis.z(), relWvel.z(), ChTime);
    }

    C_torque = Vadd(C_torque, m_torque);

    // ========== the link-limits "cushion forces"

    m_force = VNULL;
    m_torque = VNULL;

    if (limit_X && limit_X->IsActive()) {
        m_force.x() = limit_X->GetForce(relM.pos.x(), relM_dt.pos.x());
    }
    if (limit_Y && limit_Y->IsActive()) {
        m_force.y() = limit_Y->GetForce(relM.pos.y(), relM_dt.pos.y());
    }
    if (limit_Z && limit_Z->IsActive()) {
        m_force.z() = limit_Z->GetForce(relM.pos.z(), relM_dt.pos.z());
    }

    if (limit_D && limit_D->IsActive()) {
        m_force = Vadd(m_force, Vmul(Vnorm(relM.pos), limit_D->GetForce(dist, dist_dt)));
    }

    if (limit_Rx && limit_Rx->IsActive()) {
        m_torque.x() = limit_Rx->GetForce(relRotaxis.x(), relWvel.x());
    }
    if (limit_Ry && limit_Ry->IsActive()) {
        m_torque.y() = limit_Ry->GetForce(relRotaxis.y(), relWvel.y());
    }
    if (limit_Rz && limit_Rz->IsActive()) {
        m_torque.z() = limit_Rz->GetForce(relRotaxis.z(), relWvel.z());
    }
    if (limit_Rp && limit_Rp->IsActive()) {
        ChVector<> arm_xaxis = VaxisXfromQuat(relM.rot);  // the X axis of the marker1, respect to m2.
        double zenith = VangleYZplaneNorm(arm_xaxis);     // the angle of m1 Xaxis about normal to YZ plane
        double polar = VangleRX(arm_xaxis);               // the polar angle of m1 Xaxis spinning about m2 Xaxis

        ChVector<> projected_arm(0, arm_xaxis.y(), arm_xaxis.z());
        ChVector<> torq_axis;
        torq_axis = Vcross(VECT_X, projected_arm);
        torq_axis = Vnorm(torq_axis);  // the axis of torque, laying on YZ plane.

        double zenithspeed = Vdot(torq_axis, relWvel);  // the speed of zenith rotation toward cone.

        m_torque = Vadd(m_torque, Vmul(torq_axis, limit_Rp->GetPolarForce(zenith, zenithspeed, polar)));
    }

    C_force = Vadd(C_force, m_force);     // +++
    C_torque = Vadd(C_torque, m_torque);  // +++

    // ========== other forces??
}